

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O1

void __thiscall MIDIplay::describeChannels(MIDIplay *this,char *str,char *attr,size_t size)

{
  uint uVar1;
  OPL3 *pOVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  
  if (size != 0 && str != (char *)0x0) {
    pOVar2 = (this->m_synth).m_p;
    uVar7 = (ulong)pOVar2->m_numChannels;
    uVar4 = size - 1;
    if (uVar4 == 0 || uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      if (uVar7 < uVar4) {
        uVar4 = uVar7;
      }
      lVar8 = 0xc;
      uVar7 = 0;
      do {
        lVar3 = *(long *)((long)&((this->m_chipChannels).
                                  super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 koff_time_until_neglible_us + lVar8 * 4);
        if (*(long *)(lVar3 + 8) == 0) {
          cVar6 = '-';
        }
        else {
          cVar6 = '@';
          if (*(long *)(*(long *)(lVar3 + 8) + 8) == 0) {
            uVar1 = (pOVar2->m_channelCategory).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            cVar6 = 'r';
            if (uVar1 < 3) {
              cVar6 = (char)(0x23232b >> ((byte)(uVar1 << 3) & 0x1f));
            }
          }
        }
        str[uVar7] = cVar6;
        if (*(long *)(lVar3 + 8) == 0) {
          bVar5 = 0;
        }
        else {
          bVar5 = *(byte *)(lVar3 + 0x10) & 0xf;
        }
        attr[uVar7] = bVar5;
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x16;
      } while (uVar7 < uVar4);
    }
    str[uVar7] = '\0';
    attr[uVar7] = '\0';
  }
  return;
}

Assistant:

void MIDIplay::describeChannels(char *str, char *attr, size_t size)
{
    if (!str || size <= 0)
        return;

    Synth &synth = *m_synth;
    uint32_t numChannels = synth.m_numChannels;

    uint32_t index = 0;

    while(index < numChannels && index < size - 1)
    {
        const AdlChannel &adlChannel = m_chipChannels[index];

        AdlChannel::const_users_iterator loc = adlChannel.users.begin();
        AdlChannel::const_users_iterator locnext(loc);

        if(!loc.is_end())
            ++locnext;

        if(loc.is_end())  // off
            str[index] = '-';
        else if(!locnext.is_end())  // arpeggio
            str[index] = '@';
        else  // on
        {
            switch(synth.m_channelCategory[index])
            {
            case Synth::ChanCat_Regular:
                str[index] = '+';
                break;
            case Synth::ChanCat_4op_First:
            case Synth::ChanCat_4op_Second:
                str[index] = '#';
                break;
            default:  // rhythm-mode percussion
                str[index] = 'r';
                break;
            }
        }

        uint8_t attribute = 0;
        if(!loc.is_end())  // 4-bit color index of MIDI channel
            attribute |= (uint8_t)(loc->value.loc.MidCh & 0xF);

        attr[index] = (char)attribute;
        ++index;
    }

    str[index] = 0;
    attr[index] = 0;
}